

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

int luaV_equalobj(lua_State *L,TValue *t1,TValue *t2)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  ushort uVar3;
  undefined8 uVar4;
  int iVar5;
  TValue *f;
  GCObject *pGVar6;
  GCObject *pGVar7;
  ushort uVar8;
  uint uVar9;
  char *pcVar10;
  Table *pTVar11;
  bool bVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  uVar2 = t1->tt_;
  uVar3 = t2->tt_;
  uVar8 = uVar2 & 0x7f;
  if (uVar8 != (uVar3 & 0x7f)) {
    if ((uVar3 & 0xf) != 3 || (uVar2 & 0xf) != 3) {
      return 0;
    }
    if (uVar2 == 3) {
      auVar15._8_8_ = 0;
      auVar15._0_8_ = (t1->value_).n;
      auVar15 = vroundsd_avx(auVar15,auVar15,9);
      dVar13 = auVar15._0_8_;
      if (dVar13 != (t1->value_).n) {
        return 0;
      }
      if (dVar13 < -9.223372036854776e+18) {
        return 0;
      }
      if (9.223372036854776e+18 <= dVar13) {
        return 0;
      }
      pGVar7 = (GCObject *)(long)dVar13;
    }
    else {
      if (uVar2 != 0x13) {
        return 0;
      }
      pGVar7 = (t1->value_).gc;
    }
    if (uVar3 == 3) {
      auVar16._8_8_ = 0;
      auVar16._0_8_ = (t2->value_).n;
      auVar15 = vroundsd_avx(auVar16,auVar16,9);
      dVar13 = auVar15._0_8_;
      if (dVar13 != (t2->value_).n) {
        return 0;
      }
      if (dVar13 < -9.223372036854776e+18) {
        return 0;
      }
      if (9.223372036854776e+18 <= dVar13) {
        return 0;
      }
      pGVar6 = (GCObject *)(long)dVar13;
    }
    else {
      if (uVar3 != 0x13) {
        return 0;
      }
      pGVar6 = (t2->value_).gc;
    }
    goto LAB_0013f775;
  }
  uVar9 = 1;
  switch(uVar8) {
  case 0:
    goto switchD_0013f4fb_caseD_0;
  case 1:
    if (uVar2 != 1) {
      pcVar10 = "((((t1))->tt_) == (1))";
LAB_0013f9f6:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2eb,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (uVar3 != 1) {
      pcVar10 = "((((t2))->tt_) == (1))";
      goto LAB_0013f9f6;
    }
    bVar12 = (t1->value_).b == (t2->value_).b;
    goto LAB_0013f7d4;
  case 2:
    if (uVar2 != 2) {
      pcVar10 = "((((t1))->tt_) == (2))";
LAB_0013f976:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ec,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (uVar3 != 2) {
      pcVar10 = "((((t2))->tt_) == (2))";
      goto LAB_0013f976;
    }
    break;
  case 3:
    if (uVar2 == 3) {
      if (uVar3 == 3) {
        auVar14._8_8_ = 0;
        auVar14._0_8_ = (t1->value_).i;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (t2->value_).i;
        uVar4 = vcmpsd_avx512f(auVar14,auVar1,0);
        return (uint)uVar4 & 1;
      }
      pcVar10 = "((((t2))->tt_) == (((3) | ((0) << 4))))";
    }
    else {
      pcVar10 = "((((t1))->tt_) == (((3) | ((0) << 4))))";
    }
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x2ea,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
  case 4:
    if ((uVar2 & 0xf) != 4) {
      pcVar10 = "(((((((t1))->tt_)) & 0x0F)) == (4))";
LAB_0013faf2:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ef,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    pGVar7 = (t1->value_).gc;
    if ((pGVar7->tt & 0xf) != 4) {
      pcVar10 = "(((((t1)->value_).gc)->tt) & 0x0F) == 4";
      goto LAB_0013faf2;
    }
    if (pGVar7->tt != 4) {
      pcVar10 = 
      "((((void) sizeof (((((((((t1))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((t1))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((t1))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c\", 751, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((t1)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((t1)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((t1)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c\", 751, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((t1)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
      ;
      goto LAB_0013faf2;
    }
    if ((uVar3 & 0xf) != 4) {
      pcVar10 = "(((((((t2))->tt_)) & 0x0F)) == (4))";
      goto LAB_0013faf2;
    }
    pGVar6 = (t2->value_).gc;
    if ((pGVar6->tt & 0xf) != 4) {
      pcVar10 = "(((((t2)->value_).gc)->tt) & 0x0F) == 4";
      goto LAB_0013faf2;
    }
    goto LAB_0013f775;
  case 5:
    if (uVar2 != 0x8005) {
      pcVar10 = "((((t1))->tt_) == (((5) | (1 << 15))))";
LAB_0013fad3:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ff,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    pGVar7 = (GCObject *)(t1->value_).f;
    if (pGVar7->tt != '\x05') {
      pcVar10 = "(((t1)->value_).gc)->tt == 5";
      goto LAB_0013fad3;
    }
    if (uVar3 != 0x8005) {
      pcVar10 = "((((t2))->tt_) == (((5) | (1 << 15))))";
      goto LAB_0013fad3;
    }
    if (((t2->value_).gc)->tt != '\x05') {
      pcVar10 = "(((t2)->value_).gc)->tt == 5";
      goto LAB_0013fad3;
    }
    if (pGVar7 == (t2->value_).gc) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    pTVar11 = *(Table **)&pGVar7[2].tt;
    if ((pTVar11 != (Table *)0x0) && ((pTVar11->flags & 0x20) == 0)) {
      f = luaT_gettm(pTVar11,TM_EQ,L->l_G->tmname[5]);
      if (f != (TValue *)0x0) goto LAB_0013f899;
      if (t2->tt_ != 0x8005) {
        pcVar10 = "((((t2))->tt_) == (((5) | (1 << 15))))";
        goto LAB_0013fb61;
      }
    }
    if ((t2->value_).f[8] != (_func_int_lua_State_ptr)0x5) {
      pcVar10 = "(((t2)->value_).gc)->tt == 5";
LAB_0013fb61:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x303,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    pTVar11 = *(Table **)((t2->value_).f + 0x28);
    goto LAB_0013f868;
  case 6:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
switchD_0013f4fb_caseD_6:
    if (-1 < (short)uVar2) {
      pcVar10 = "(((t1)->tt_) & (1 << 15))";
LAB_0013f933:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x307,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (-1 < (short)uVar3) {
      pcVar10 = "(((t2)->tt_) & (1 << 15))";
      goto LAB_0013f933;
    }
    break;
  case 7:
    if (uVar2 != 0x8007) {
      pcVar10 = "((((t1))->tt_) == (((7) | (1 << 15))))";
LAB_0013faab:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2f2,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    pGVar7 = (GCObject *)(t1->value_).f;
    if (pGVar7->tt != '\a') {
      pcVar10 = "(((t1)->value_).gc)->tt == 7";
      goto LAB_0013faab;
    }
    if (uVar3 != 0x8007) {
      pcVar10 = "((((t2))->tt_) == (((7) | (1 << 15))))";
      goto LAB_0013faab;
    }
    if (((t2->value_).gc)->tt != '\a') {
      pcVar10 = "(((t2)->value_).gc)->tt == 7";
      goto LAB_0013faab;
    }
    if (pGVar7 == (t2->value_).gc) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    pTVar11 = (Table *)pGVar7[1].next;
    if ((pTVar11 != (Table *)0x0) && ((pTVar11->flags & 0x20) == 0)) {
      f = luaT_gettm(pTVar11,TM_EQ,L->l_G->tmname[5]);
      if (f != (TValue *)0x0) goto LAB_0013f899;
      if (t2->tt_ != 0x8007) {
        pcVar10 = "((((t2))->tt_) == (((7) | (1 << 15))))";
        goto LAB_0013fb42;
      }
    }
    if ((t2->value_).f[8] != (_func_int_lua_State_ptr)0x7) {
      pcVar10 = "(((t2)->value_).gc)->tt == 7";
LAB_0013fb42:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2f6,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    pTVar11 = *(Table **)((t2->value_).f + 0x10);
LAB_0013f868:
    if (pTVar11 == (Table *)0x0) {
      return 0;
    }
    if ((pTVar11->flags & 0x20) != 0) {
      return 0;
    }
    f = luaT_gettm(pTVar11,TM_EQ,L->l_G->tmname[5]);
    if (f == (TValue *)0x0) {
      return 0;
    }
LAB_0013f899:
    luaT_callTM(L,f,t1,t2,L->top,1);
    uVar2 = L->top->tt_;
    if (uVar2 == 0) {
      return (uint)uVar2;
    }
    if (uVar2 == 1) {
      return (uint)((L->top->value_).b != 0);
    }
    return 1;
  case 0x13:
    if (uVar2 != 0x13) {
      pcVar10 = "((((t1))->tt_) == (((3) | ((1) << 4))))";
LAB_0013fa40:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2e9,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (uVar3 != 0x13) {
      pcVar10 = "((((t2))->tt_) == (((3) | ((1) << 4))))";
      goto LAB_0013fa40;
    }
    break;
  case 0x14:
    if ((uVar2 & 0xf) == 4) {
      if ((((TString *)(t1->value_).gc)->tt & 0xf) == 4) {
        if ((uVar3 & 0xf) == 4) {
          if ((((TString *)(t2->value_).gc)->tt & 0xf) == 4) {
            iVar5 = luaS_eqlngstr((TString *)(t1->value_).gc,(TString *)(t2->value_).gc);
            return iVar5;
          }
          pcVar10 = "(((((t2)->value_).gc)->tt) & 0x0F) == 4";
        }
        else {
          pcVar10 = "(((((((t2))->tt_)) & 0x0F)) == (4))";
        }
      }
      else {
        pcVar10 = "(((((t1)->value_).gc)->tt) & 0x0F) == 4";
      }
    }
    else {
      pcVar10 = "(((((((t1))->tt_)) & 0x0F)) == (4))";
    }
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x2f0,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
  case 0x15:
switchD_0013f4fb_caseD_15:
    if ((uVar2 != 0x8015) && (uVar2 != 0x8025)) {
      pcVar10 = 
      "(((((t1))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t1))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
      ;
LAB_0013fb23:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2fb,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    pGVar7 = (t1->value_).gc;
    if ((pGVar7->tt != '\x15') && (pGVar7->tt != '%')) {
      pcVar10 = 
      "((((t1)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t1)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_0013fb23;
    }
    if ((uVar3 != 0x8015) && (uVar3 != 0x8025)) {
      pcVar10 = 
      "(((((t2))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t2))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
      ;
      goto LAB_0013fb23;
    }
    pGVar6 = (t2->value_).gc;
    if ((pGVar6->tt != '\x15') && (pGVar6->tt != '%')) {
      pcVar10 = 
      "((((t2)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t2)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_0013fb23;
    }
LAB_0013f775:
    bVar12 = pGVar7 == pGVar6;
    goto LAB_0013f7d4;
  case 0x16:
    if (uVar2 != 0x16) {
      pcVar10 = "((((t1))->tt_) == (((6) | ((1) << 4))))";
LAB_0013f9aa:
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ed,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (uVar3 != 0x16) {
      pcVar10 = "((((t2))->tt_) == (((6) | ((1) << 4))))";
      goto LAB_0013f9aa;
    }
    break;
  default:
    if (uVar8 == 0x25) goto switchD_0013f4fb_caseD_15;
    if (uVar8 != 0x46) goto switchD_0013f4fb_caseD_6;
  }
  bVar12 = (t1->value_).gc == (t2->value_).gc;
LAB_0013f7d4:
  uVar9 = (uint)bVar12;
switchD_0013f4fb_caseD_0:
  return uVar9;
}

Assistant:

int luaV_equalobj (lua_State *L, const TValue *t1, const TValue *t2) {
  const TValue *tm;
  if (ttype(t1) != ttype(t2)) {  /* not the same variant? */
    if (ttnov(t1) != ttnov(t2) || ttnov(t1) != LUA_TNUMBER)
      return 0;  /* only numbers can be equal with different variants */
    else {  /* two numbers with different variants */
      lua_Integer i1, i2;  /* compare them as integers */
      return (tointegerns(t1, &i1) && tointegerns(t2, &i2) && i1 == i2);
    }
  }
  /* values have same type and same variant */
  switch (ttype(t1)) {
    case LUA_TNIL: return 1;
    case LUA_TNUMINT: return (ivalue(t1) == ivalue(t2));
    case LUA_TNUMFLT: return luai_numeq(fltvalue(t1), fltvalue(t2));
    case LUA_TBOOLEAN: return bvalue(t1) == bvalue(t2);  /* true must be 1 !! */
    case LUA_TLIGHTUSERDATA: return pvalue(t1) == pvalue(t2);
    case LUA_TLCF: return fvalue(t1) == fvalue(t2);
	case RAVI_TFCF: return fcfvalue(t1) == fcfvalue(t2);
    case LUA_TSHRSTR: return eqshrstr(tsvalue(t1), tsvalue(t2));
    case LUA_TLNGSTR: return luaS_eqlngstr(tsvalue(t1), tsvalue(t2));
    case LUA_TUSERDATA: {
      if (uvalue(t1) == uvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, uvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, uvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    case RAVI_TIARRAY:
    case RAVI_TFARRAY: {
      if (arrvalue(t1) == arrvalue(t2)) return 1;
      else return 0;
    }
    case LUA_TTABLE: {
      if (hvalue(t1) == hvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, hvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, hvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    default:
      return gcvalue(t1) == gcvalue(t2);
  }
  if (tm == NULL)  /* no TM? */
    return 0;  /* objects are different */
  luaT_callTM(L, tm, t1, t2, L->top, 1);  /* call TM */
  return !l_isfalse(L->top);
}